

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O2

bool __thiscall BmsParser::Parser::Parse(Parser *this,char *text)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  char *local_58;
  string buf;
  
  Clear(this);
  BmsBms::Clear(this->bms_);
  WriteLogLine(this,"Bms parsing started");
  iVar2 = BmsUtil::IsUTF8(text);
  if (iVar2 == 0) {
    pcVar3 = (char *)operator_new__(0xa00000);
    bVar1 = BmsUtil::convert_to_utf8(text,pcVar3,"Shift_JIS",0xa00000);
    local_58 = pcVar3;
    if (bVar1) goto LAB_0012fd6a;
    operator_delete(pcVar3);
  }
  local_58 = (char *)0x0;
  pcVar3 = text;
LAB_0012fd6a:
  do {
    if ((pcVar3 == (char *)0x0) || (this->panic_ != false)) break;
    pcVar3 = anon_unknown_2::Trim(pcVar3);
    pcVar4 = strchr(pcVar3,10);
    buf._M_dataplus._M_p = (pointer)&buf.field_2;
    buf._M_string_length = 0;
    buf.field_2._M_local_buf[0] = '\0';
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::assign((char *)&buf);
    }
    else {
      std::__cxx11::string::assign((char *)&buf,(ulong)pcVar3);
    }
    while (((buf._M_string_length != 0 &&
            ((ulong)(byte)buf._M_dataplus._M_p[buf._M_string_length - 1] < 0x21)) &&
           ((0x100002200U >> ((ulong)(byte)buf._M_dataplus._M_p[buf._M_string_length - 1] & 0x3f) &
            1) != 0))) {
      std::__cxx11::string::resize((ulong)&buf);
    }
    bVar1 = IsRandomStatement(this,buf._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&this->syntax_line_data_ + (ulong)!bVar1 * 0x20),&buf);
    pcVar3 = pcVar4 + 1;
    std::__cxx11::string::~string((string *)&buf);
  } while (pcVar4 != (char *)0x0);
  if (local_58 != (char *)0x0) {
    operator_delete__(local_58);
  }
  sVar5 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->syntax_tag_);
  if (sVar5 == 0) {
    if ((this->panic_ & 1U) == 0) {
      ParseLines(this);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
    WriteLogLine(this,"parsing error - statement hadn\'t finished completely.");
    this->panic_ = true;
  }
  return bVar1;
}

Assistant:

bool Parser::Parse(const char* text) {
		// initalize first
		Clear();
		bms_.Clear();
		WriteLogLine("Bms parsing started");

		// detect encoding
		char* encodetext = 0;
		if (!BmsUtil::IsUTF8(text)) {
			encodetext = new char[1024 * 1024 * 10];
			bool r = BmsUtil::convert_to_utf8(text, encodetext,
				BmsBelOption::DEFAULT_FALLBACK_ENCODING, 1024 * 1024 * 10);
			if (!r) {
				delete encodetext;
				encodetext = 0;
			}
			else {
				text = encodetext;
			}
		}

		// split lines
		for (const char *p = text; p && !panic_;) {
			// trim first
			p = Trim(p);
			// cut command
			const char* pn = strchr(p, '\n');
			std::string buf;
			if (!pn)
				buf.assign(p);
			else
				buf.assign(p, pn - p);
			// trim end of the line
			while (buf.size() > 0) {
				if (buf.back() == '\r' || buf.back() == ' ' || buf.back() == '\t')
					//buf.pop_back(); - don't work in travis
					buf.resize(buf.size() - 1);
				else
					break;
			}
			/*
			 * it's more easy and better to distinguish random statement in here
			 */
			if (IsRandomStatement(buf.c_str()))
				syntax_line_data_.push_back(buf);
			else
				line_data_.push_back(buf);
			if (!pn) break;
			p = pn + 1;
		}
		if (encodetext)
			delete[] encodetext;

		// if there's panic in random statement,
		// stop parsing
		if (syntax_tag_.size() != 0) {
			WriteLogLine("parsing error - statement hadn't finished completely.");
			panic_ = true;
		}
		if (panic_) return false;

		// parse lines
		return ParseLines();
	}